

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
LabelObjectState<true>::StartObject(LabelObjectState<true> *this,Context<true> *ctx)

{
  stringstream *psVar1;
  long in_RSI;
  BaseState<true> *in_RDI;
  Context<true> *unaff_retaddr;
  BaseState<true> *local_8;
  
  (**(code **)(*(long *)(*(long *)(in_RSI + 8) + 8) + 0x338))(*(long *)(in_RSI + 0x50) + 0x6828);
  if (*(BaseState<true> **)(in_RSI + 0x28) == in_RDI) {
    psVar1 = Context<true>::error_abi_cxx11_(unaff_retaddr);
    std::operator<<((ostream *)(psVar1 + 0x10),"invalid label object. nested objected.");
    local_8 = (BaseState<true> *)0x0;
  }
  else {
    in_RDI[1]._vptr_BaseState = *(_func_int ***)(in_RSI + 0x28);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

BaseState<audit>* StartObject(Context<audit>& ctx)
  {
    ctx.all->p->lp.default_label(&ctx.ex->l);

    // don't allow { { { } } }
    if (ctx.previous_state == this)
    {
      ctx.error() << "invalid label object. nested objected.";
      return nullptr;
    }

    // keep previous state
    return_state = ctx.previous_state;

    return this;
  }